

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__instance_node
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  bool bVar1;
  instance_node__AttributeData *piVar2;
  StringHash SVar3;
  int iVar4;
  ParserChar **ppPVar5;
  xmlChar **ppxVar6;
  bool failed;
  ParserChar *attributeValue;
  bool local_139;
  ParserTemplateBase *local_138;
  ParserChar *local_130;
  URI *local_128;
  URI *local_120;
  URI local_118;
  
  local_138 = (ParserTemplateBase *)this;
  piVar2 = GeneratedSaxParser::ParserTemplateBase::
           newData<COLLADASaxFWL15::instance_node__AttributeData>
                     ((ParserTemplateBase *)this,attributeDataPtr);
  ppxVar6 = attributes->attributes;
  if (ppxVar6 != (xmlChar **)0x0) {
    local_120 = &piVar2->url;
    local_128 = &piVar2->proxy;
    do {
      text = *ppxVar6;
      if (text == (ParserChar *)0x0) {
        iVar4 = 3;
      }
      else {
        SVar3 = GeneratedSaxParser::Utils::calculateStringHash(text);
        local_130 = ppxVar6[1];
        if ((long)SVar3 < 0x74835) {
          ppPVar5 = &piVar2->sid;
          if (SVar3 == 0x79f4) {
LAB_0074aa62:
            *ppPVar5 = local_130;
            goto LAB_0074aaa3;
          }
          if (SVar3 == 0x7c8c) {
            GeneratedSaxParser::Utils::toURI(&local_118,&local_130,&local_139);
            COLLADABU::URI::operator=(local_120,&local_118);
            COLLADABU::URI::~URI(&local_118);
            if ((local_139 == true) &&
               (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                  (local_138,SEVERITY_ERROR_NONCRITICAL,
                                   ERROR_ATTRIBUTE_PARSING_FAILED,0xa10fd95,0x7c8c,local_130), bVar1
               )) {
LAB_0074aa5b:
              bVar1 = false;
              iVar4 = 1;
            }
            else {
              iVar4 = 4;
              bVar1 = true;
              if (local_139 == false) {
                *(byte *)&piVar2->present_attributes = (byte)piVar2->present_attributes | 2;
              }
            }
            goto LAB_0074aa9e;
          }
LAB_0074aa67:
          bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                            (local_138,SEVERITY_ERROR_NONCRITICAL,ERROR_UNKNOWN_ATTRIBUTE,0xa10fd95,
                             text,local_130);
          iVar4 = 1;
          if (!bVar1) goto LAB_0074aaa3;
        }
        else {
          ppPVar5 = &piVar2->name;
          if (SVar3 == 0x74835) goto LAB_0074aa62;
          if (SVar3 != 0x7796f9) goto LAB_0074aa67;
          GeneratedSaxParser::Utils::toURI(&local_118,&local_130,&local_139);
          COLLADABU::URI::operator=(local_128,&local_118);
          COLLADABU::URI::~URI(&local_118);
          if ((local_139 == true) &&
             (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                (local_138,SEVERITY_ERROR_NONCRITICAL,ERROR_ATTRIBUTE_PARSING_FAILED
                                 ,0xa10fd95,0x7796f9,local_130), bVar1)) goto LAB_0074aa5b;
          iVar4 = 4;
          bVar1 = true;
          if (local_139 == false) {
            *(byte *)&piVar2->present_attributes = (byte)piVar2->present_attributes | 1;
          }
LAB_0074aa9e:
          if (!bVar1) goto LAB_0074aaa5;
LAB_0074aaa3:
          iVar4 = 0;
        }
LAB_0074aaa5:
        ppxVar6 = ppxVar6 + 2;
      }
    } while (iVar4 == 0);
    if (iVar4 != 3) {
      return false;
    }
  }
  if ((piVar2->present_attributes & 1) == 0) {
    COLLADABU::URI::URI(&local_118,"");
    COLLADABU::URI::operator=(&piVar2->proxy,&local_118);
    COLLADABU::URI::~URI(&local_118);
  }
  if ((piVar2->present_attributes & 2) == 0) {
    COLLADABU::URI::URI(&local_118,"");
    COLLADABU::URI::operator=(&piVar2->url,&local_118);
    COLLADABU::URI::~URI(&local_118);
  }
  if (((piVar2->present_attributes & 2) == 0) &&
     (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                        (local_138,SEVERITY_ERROR_NONCRITICAL,ERROR_REQUIRED_ATTRIBUTE_MISSING,
                         0xa10fd95,0x7c8c,(ParserChar *)0x0), bVar1)) {
    return false;
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__instance_node( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__instance_node( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

instance_node__AttributeData* attributeData = newData<instance_node__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_PROXY:
    {
bool failed;
attributeData->proxy = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_INSTANCE_NODE,
        HASH_ATTRIBUTE_PROXY,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= instance_node__AttributeData::ATTRIBUTE_PROXY_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_URL:
    {
bool failed;
attributeData->url = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_INSTANCE_NODE,
        HASH_ATTRIBUTE_URL,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= instance_node__AttributeData::ATTRIBUTE_URL_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_SID:
    {

attributeData->sid = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__sid_type(attributeData->sid, strlen(attributeData->sid));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_INSTANCE_NODE,
            HASH_ATTRIBUTE_SID,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    case HASH_ATTRIBUTE_NAME:
    {

attributeData->name = attributeValue;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_INSTANCE_NODE, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ((attributeData->present_attributes & instance_node__AttributeData::ATTRIBUTE_PROXY_PRESENT) == 0)
{
    attributeData->proxy = COLLADABU::URI("");
}
if ((attributeData->present_attributes & instance_node__AttributeData::ATTRIBUTE_URL_PRESENT) == 0)
{
    attributeData->url = COLLADABU::URI("");
}
if ( (attributeData->present_attributes & instance_node__AttributeData::ATTRIBUTE_URL_PRESENT) == 0 )
{
    if ( handleError ( ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_REQUIRED_ATTRIBUTE_MISSING, HASH_ELEMENT_INSTANCE_NODE, HASH_ATTRIBUTE_URL, 0 ) )
        return false;
}


    return true;
}